

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

unsigned_long * __thiscall
kj::Vector<unsigned_long>::add<unsigned_long>(Vector<unsigned_long> *this,unsigned_long *params)

{
  bool bVar1;
  unsigned_long *puVar2;
  unsigned_long *params_local;
  Vector<unsigned_long> *this_local;
  
  bVar1 = ArrayBuilder<unsigned_long>::isFull(&this->builder);
  if (bVar1) {
    grow(this,0);
  }
  puVar2 = fwd<unsigned_long>(params);
  puVar2 = ArrayBuilder<unsigned_long>::add<unsigned_long>(&this->builder,puVar2);
  return puVar2;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }